

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NanoVM.cpp
# Opt level: O0

unsigned_long __thiscall NanoVM::pop<unsigned_long>(NanoVM *this)

{
  unsigned_long value;
  NanoVM *this_local;
  
  if ((this->cpu).registers[7] - 8 < (this->cpu).codeSize) {
    this->errorFlag = 0x80;
    this_local = (NanoVM *)0x0;
  }
  else {
    this_local = *(NanoVM **)((this->cpu).codeBase + ((this->cpu).registers[7] - 8));
    (this->cpu).registers[7] = (this->cpu).registers[7] - 8;
  }
  return (unsigned_long)this_local;
}

Assistant:

inline T NanoVM::pop() {
	// Check bounds
	if (cpu.registers[esp] - sizeof(T) < cpu.codeSize) {
		// Reached the bottom of stack
		errorFlag = STACK_ERROR;
		return 0;
	}
	// pop value from stack
	T value = *reinterpret_cast<T*>(cpu.codeBase + cpu.registers[esp] - sizeof(T));
	// update esp
	cpu.registers[esp] -= sizeof(value);
	return value;
}